

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

iterator * __thiscall
spvtools::EnumSet<spv::Capability>::cbegin
          (iterator *__return_storage_ptr__,EnumSet<spv::Capability> *this)

{
  bool bVar1;
  size_type sVar2;
  EnumSet<spv::Capability> *this_local;
  iterator *it;
  
  Iterator::Iterator(__return_storage_ptr__,this,0,0);
  sVar2 = std::
          vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ::size(&this->buckets_);
  if ((sVar2 != 0) &&
     (bVar1 = HasEnumAt(this,__return_storage_ptr__->bucketIndex_,
                        (ulong)__return_storage_ptr__->bucketOffset_), !bVar1)) {
    Iterator::operator++(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator cbegin() const noexcept {
    auto it = iterator(this, /* bucketIndex= */ 0, /* bucketOffset= */ 0);
    if (buckets_.size() == 0) {
      return it;
    }

    // The iterator has the logic to find the next valid bit. If the value 0
    // is not stored, use it to find the next valid bit.
    if (!HasEnumAt(it.bucketIndex_, it.bucketOffset_)) {
      ++it;
    }

    return it;
  }